

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O0

int VP8LResidualImage(int width,int height,int min_bits,int max_bits,int low_effort,uint32_t *argb,
                     uint32_t *argb_scratch,uint32_t *image,int near_lossless_quality,int exact,
                     int used_subtract_green,WebPPicture *pic,int percent_range,int *percent,
                     int *best_bits)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  void *pvVar5;
  uint32_t in_ECX;
  uint32_t in_EDX;
  uint32_t **unaff_RBX;
  uint32_t in_ESI;
  uint32_t in_EDI;
  int in_R8D;
  undefined8 in_R9;
  int *unaff_R12;
  uint32_t **unaff_R13;
  void *in_stack_00000010;
  int in_stack_00000018;
  undefined4 in_stack_00000020;
  uint32_t *in_stack_00000048;
  int tiles_per_col_1;
  int tiles_per_row_1;
  uint32_t num_pixels [10];
  uint32_t *modes [10];
  uint32_t *best_mode;
  uint32_t *modes_raw;
  uint32_t sum_num_pixels;
  int bits;
  int i;
  int tiles_per_col;
  int tiles_per_row;
  int max_quantization;
  int percent_start;
  undefined4 in_stack_fffffffffffffe8c;
  undefined4 in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  uint auStack_108 [4];
  uint32_t *in_stack_ffffffffffffff08;
  uint32_t *in_stack_ffffffffffffff10;
  uint32_t *in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff24;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  int in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  void *local_80;
  uint32_t local_68;
  int local_64;
  int in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffcc;
  
  local_68 = in_EDX;
  iVar1 = VP8LNearLosslessBits(in_stack_00000018);
  iVar1 = 1 << ((byte)iVar1 & 0x1f);
  uVar2 = local_68;
  if (in_R8D == 0) {
    for (; (int)local_68 <= (int)in_ECX; local_68 = local_68 + 1) {
      uVar3 = VP8LSubSampleSize(in_EDI,local_68);
      uVar4 = VP8LSubSampleSize(in_ESI,local_68);
      auStack_108[(int)local_68] = uVar3 * uVar4;
    }
    pvVar5 = WebPSafeMalloc(CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                            CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    if (pvVar5 == (void *)0x0) {
      return 0;
    }
    *(void **)(&stack0xffffffffffffff28 + (long)(int)uVar2 * 8) = pvVar5;
    uVar3 = uVar2;
    while (local_68 = uVar3 + 1, (int)local_68 <= (int)in_ECX) {
      *(ulong *)(&stack0xffffffffffffff28 + (long)(int)local_68 * 8) =
           *(long *)(&stack0xffffffffffffff28 + (long)(int)uVar3 * 8) +
           (ulong)auStack_108[(int)uVar3] * 4;
      uVar3 = local_68;
    }
    GetBestPredictorsAndSubSampling
              (in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
               in_stack_ffffffffffffff70,
               (uint32_t *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
               (uint32_t *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffffa0,iVar1,(int)in_R9,(WebPPicture *)CONCAT44(in_ECX,in_R8D),
               uVar2,(int *)CONCAT44(in_stack_ffffffffffffffcc,in_EDI),unaff_RBX,unaff_R12,unaff_R13
              );
    if (*in_stack_00000048 == 0) {
      WebPSafeFree((void *)0x197857);
      return 0;
    }
    uVar2 = VP8LSubSampleSize(in_EDI,*in_stack_00000048);
    uVar3 = VP8LSubSampleSize(in_ESI,*in_stack_00000048);
    memcpy(in_stack_00000010,local_80,(ulong)(uVar2 * uVar3) << 2);
    WebPSafeFree((void *)0x1978de);
  }
  else {
    uVar2 = VP8LSubSampleSize(in_EDI,in_ECX);
    uVar3 = VP8LSubSampleSize(in_ESI,in_ECX);
    for (local_64 = 0; local_64 < (int)(uVar2 * uVar3); local_64 = local_64 + 1) {
      *(undefined4 *)((long)in_stack_00000010 + (long)local_64 * 4) = 0xff000b00;
    }
    *in_stack_00000048 = in_ECX;
  }
  CopyImageWithPrediction
            (in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
             in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
             in_stack_ffffffffffffff60,in_stack_ffffffffffffff68,in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff78);
  iVar1 = WebPReportProgress((WebPPicture *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_00000020),
                             in_stack_fffffffffffffe94,
                             (int *)CONCAT44(in_stack_fffffffffffffe8c,in_R8D));
  return iVar1;
}

Assistant:

int VP8LResidualImage(int width, int height, int min_bits, int max_bits,
                      int low_effort, uint32_t* const argb,
                      uint32_t* const argb_scratch, uint32_t* const image,
                      int near_lossless_quality, int exact,
                      int used_subtract_green, const WebPPicture* const pic,
                      int percent_range, int* const percent,
                      int* const best_bits) {
  int percent_start = *percent;
  const int max_quantization = 1 << VP8LNearLosslessBits(near_lossless_quality);
  if (low_effort) {
    const int tiles_per_row = VP8LSubSampleSize(width, max_bits);
    const int tiles_per_col = VP8LSubSampleSize(height, max_bits);
    int i;
    for (i = 0; i < tiles_per_row * tiles_per_col; ++i) {
      image[i] = ARGB_BLACK | (kPredLowEffort << 8);
    }
    *best_bits = max_bits;
  } else {
    // Allocate data to try all samplings from min_bits to max_bits.
    int bits;
    uint32_t sum_num_pixels = 0u;
    uint32_t *modes_raw, *best_mode;
    uint32_t* modes[MAX_TRANSFORM_BITS + 1];
    uint32_t num_pixels[MAX_TRANSFORM_BITS + 1];
    for (bits = min_bits; bits <= max_bits; ++bits) {
      const int tiles_per_row = VP8LSubSampleSize(width, bits);
      const int tiles_per_col = VP8LSubSampleSize(height, bits);
      num_pixels[bits] = tiles_per_row * tiles_per_col;
      sum_num_pixels += num_pixels[bits];
    }
    modes_raw = (uint32_t*)WebPSafeMalloc(sum_num_pixels, sizeof(*modes_raw));
    if (modes_raw == NULL) return 0;
    // Have modes point to the right global memory modes_raw.
    modes[min_bits] = modes_raw;
    for (bits = min_bits + 1; bits <= max_bits; ++bits) {
      modes[bits] = modes[bits - 1] + num_pixels[bits - 1];
    }
    // Find the best sampling.
    GetBestPredictorsAndSubSampling(
        width, height, min_bits, max_bits, argb_scratch, argb, max_quantization,
        exact, used_subtract_green, pic, percent_range, percent,
        &modes[min_bits], best_bits, &best_mode);
    if (*best_bits == 0) {
      WebPSafeFree(modes_raw);
      return 0;
    }
    // Keep the best predictor image.
    memcpy(image, best_mode,
           VP8LSubSampleSize(width, *best_bits) *
               VP8LSubSampleSize(height, *best_bits) * sizeof(*image));
    WebPSafeFree(modes_raw);
  }

  CopyImageWithPrediction(width, height, *best_bits, image, argb_scratch, argb,
                          low_effort, max_quantization, exact,
                          used_subtract_green);
  return WebPReportProgress(pic, percent_start + percent_range, percent);
}